

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O0

string * cfd::api::json::
         ExecuteDirectApi<cfd::api::json::ElementsDecodeRawTransactionRequest,cfd::api::json::ElementsDecodeRawTransactionResponse>
                   (string *request_message,
                   function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
                   *function)

{
  string *in_RDI;
  ElementsDecodeRawTransactionResponse response;
  CfdException *cfd_except;
  CfdException ex;
  ElementsDecodeRawTransactionRequest req;
  ElementsDecodeRawTransactionResponse *in_stack_fffffffffffffd80;
  ElementsDecodeRawTransactionRequest *in_stack_fffffffffffffd88;
  function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
  *in_stack_fffffffffffffd90;
  ElementsDecodeRawTransactionRequest *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffde8;
  ElementsDecodeRawTransactionResponse *in_stack_fffffffffffffdf0;
  JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionResponse> *in_stack_fffffffffffffed8;
  
  ElementsDecodeRawTransactionRequest::ElementsDecodeRawTransactionRequest
            (in_stack_fffffffffffffdd0);
  core::JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionRequest>::Deserialize
            ((JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionRequest> *)
             in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ElementsDecodeRawTransactionResponse::ElementsDecodeRawTransactionResponse
            (in_stack_fffffffffffffdf0);
  std::
  function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
  ::operator()(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  core::JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionResponse>::Serialize_abi_cxx11_
            (in_stack_fffffffffffffed8);
  ElementsDecodeRawTransactionResponse::~ElementsDecodeRawTransactionResponse
            (in_stack_fffffffffffffd80);
  ElementsDecodeRawTransactionRequest::~ElementsDecodeRawTransactionRequest
            ((ElementsDecodeRawTransactionRequest *)in_stack_fffffffffffffd80);
  return in_RDI;
}

Assistant:

std::string ExecuteDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    throw cfd_except;
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    throw ex;
  }

  ResponseType response;
  function(&req, &response);
  return response.Serialize();
}